

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O3

void __thiscall
agge::tests::LayoutTests::SingleLineUnboundLayoutBoxEqualsSumOfAdvances(LayoutTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  FailedAssertion *pFVar6;
  long lVar7;
  layout l4;
  factory_ptr f1;
  factory_ptr f2;
  layout l5;
  layout l3;
  layout l2;
  layout l1;
  char_to_index indices2 [3];
  char_to_index indices1 [3];
  string local_340;
  richtext_t local_320;
  undefined1 local_2b8 [24];
  vector<agge::glyph_run,_std::allocator<agge::glyph_run>_> vStack_2a0;
  pointer local_288;
  pointer ptStack_280;
  pointer local_278;
  box_r local_270;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [24];
  vector<agge::glyph_run,_std::allocator<agge::glyph_run>_> vStack_230;
  pointer local_218;
  pointer ptStack_210;
  pointer local_208;
  box_r local_200;
  string local_1f8;
  box_r local_1d8;
  undefined8 uStack_1d0;
  box_r local_1c8;
  undefined8 uStack_1c0;
  box_r local_1b8;
  undefined8 uStack_1b0;
  layout local_1a8;
  layout local_158;
  layout local_108;
  double local_b8 [10];
  glyph local_68;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_68.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x100000041;
  uStack_40 = 0x42;
  local_38 = 0x51;
  local_b8[0] = 13.0;
  local_b8[1] = 0.0;
  local_b8[2] = 0.0;
  local_b8[3] = 0.0;
  local_b8[4] = 0.0;
  local_b8[5] = 11.0;
  local_b8[6] = 0.0;
  local_b8[7] = 0.0;
  local_b8[8] = 0.0;
  local_b8[9] = 0.0;
  create_single_font_factory<3ul,2ul>
            ((LayoutTests *)local_268,(font_metrics *)this,
             (char_to_index (*) [3])(anonymous_namespace)::c_fm1,
             (glyph (*) [2])
             &local_68.outline.
              super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_108._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108._glyphs._limit = (positioned_glyph *)0x0;
  local_108._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108._glyphs._begin = (positioned_glyph *)0x0;
  local_108._glyphs._end = (positioned_glyph *)0x0;
  local_108._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158._glyphs._limit = (positioned_glyph *)0x0;
  local_158._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158._glyphs._begin = (positioned_glyph *)0x0;
  local_158._glyphs._end = (positioned_glyph *)0x0;
  local_1a8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._glyphs._limit = (positioned_glyph *)0x0;
  local_1a8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8._glyphs._begin = (positioned_glyph *)0x0;
  local_1a8._glyphs._end = (positioned_glyph *)0x0;
  pcVar3 = local_2b8 + 0x10;
  local_2b8._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"A","");
  R(&local_320,(string *)local_2b8);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&local_108,&local_320,local_268._0_8_);
  paVar5 = &local_320._base_annotation.basic.family.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._base_annotation.basic.family._M_dataplus._M_p != paVar5) {
    operator_delete(local_320._base_annotation.basic.family._M_dataplus._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector(&local_320._annotations);
  paVar1 = &local_320._underlying.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._underlying._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._underlying._M_dataplus._M_p);
  }
  if ((pointer)local_2b8._0_8_ != pcVar3) {
    operator_delete((void *)local_2b8._0_8_);
  }
  local_2b8._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"AAB","");
  R(&local_320,(string *)local_2b8);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&local_158,&local_320,local_268._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._base_annotation.basic.family._M_dataplus._M_p != paVar5) {
    operator_delete(local_320._base_annotation.basic.family._M_dataplus._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector(&local_320._annotations);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._underlying._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._underlying._M_dataplus._M_p);
  }
  if ((pointer)local_2b8._0_8_ != pcVar3) {
    operator_delete((void *)local_2b8._0_8_);
  }
  local_2b8._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"BQA","");
  R(&local_320,(string *)local_2b8);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&local_1a8,&local_320,local_268._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._base_annotation.basic.family._M_dataplus._M_p != paVar5) {
    operator_delete(local_320._base_annotation.basic.family._M_dataplus._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector(&local_320._annotations);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._underlying._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._underlying._M_dataplus._M_p);
  }
  if ((pointer)local_2b8._0_8_ != pcVar3) {
    operator_delete((void *)local_2b8._0_8_);
  }
  local_1c8 = local_108._box;
  uStack_1c0 = 0;
  local_1d8 = local_158._box;
  uStack_1d0 = 0;
  local_1b8 = local_1a8._box;
  uStack_1b0 = 0;
  pcVar4 = local_248 + 0x10;
  local_248._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_320,(string *)local_248,0x5e);
  if ((local_1c8.w != 11.0) || (NAN(local_1c8.w))) {
    pFVar6 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_2b8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar6,(string *)local_2b8,(LocationInfo *)&local_320);
    __cxa_throw(pFVar6,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._underlying._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._underlying._M_dataplus._M_p);
  }
  if ((pointer)local_248._0_8_ != pcVar4) {
    operator_delete((void *)local_248._0_8_);
  }
  local_248._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_320,(string *)local_248,0x5f);
  if ((local_1d8.w != 35.0) || (NAN(local_1d8.w))) {
    pFVar6 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_2b8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar6,(string *)local_2b8,(LocationInfo *)&local_320);
    __cxa_throw(pFVar6,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._underlying._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._underlying._M_dataplus._M_p);
  }
  if ((pointer)local_248._0_8_ != pcVar4) {
    operator_delete((void *)local_248._0_8_);
  }
  local_248._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_320,(string *)local_248,0x60);
  if ((local_1b8.w != 37.0) || (NAN(local_1b8.w))) {
    pFVar6 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_2b8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar6,(string *)local_2b8,(LocationInfo *)&local_320);
    __cxa_throw(pFVar6,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._underlying._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._underlying._M_dataplus._M_p);
  }
  if ((pointer)local_248._0_8_ != pcVar4) {
    operator_delete((void *)local_248._0_8_);
  }
  local_68.metrics.dx = 3.2114266979681e-322;
  local_68.metrics.dy = 3.26083326255223e-322;
  local_68.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x51;
  create_single_font_factory<3ul,2ul>
            ((LayoutTests *)local_258,(font_metrics *)this,
             (char_to_index (*) [3])(anonymous_namespace)::c_fm1,(glyph (*) [2])&local_68);
  local_288 = (pointer)0x0;
  ptStack_280 = (pointer)0x0;
  vStack_2a0.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_2a0.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8._16_8_ = 0;
  vStack_2a0.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8._0_8_ = (pointer)0x0;
  local_2b8._8_8_ = (positioned_glyph *)0x0;
  local_278 = (pointer)0x0;
  local_208 = (pointer)0x0;
  local_218 = (pointer)0x0;
  ptStack_210 = (pointer)0x0;
  vStack_230.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_230.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248._16_8_ = 0;
  vStack_230.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_248._0_8_ = (pointer)0x0;
  local_248._8_8_ = (positioned_glyph *)0x0;
  paVar2 = &local_340.field_2;
  local_340._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"A","");
  R(&local_320,&local_340);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            ((layout *)local_2b8,&local_320,local_258._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._base_annotation.basic.family._M_dataplus._M_p != paVar5) {
    operator_delete(local_320._base_annotation.basic.family._M_dataplus._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector(&local_320._annotations);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._underlying._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._underlying._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != paVar2) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  local_340._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"ABQABQABQ","");
  R(&local_320,&local_340);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            ((layout *)local_248,&local_320,local_258._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._base_annotation.basic.family._M_dataplus._M_p != paVar5) {
    operator_delete(local_320._base_annotation.basic.family._M_dataplus._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector(&local_320._annotations);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._underlying._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._underlying._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != paVar2) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  local_1c8 = local_270;
  uStack_1c0 = 0;
  local_1d8 = local_200;
  uStack_1d0 = 0;
  paVar5 = &local_1f8.field_2;
  local_1f8._M_dataplus._M_p = (pointer)paVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_320,&local_1f8,0x72);
  if ((local_1c8.w == 13.0) && (!NAN(local_1c8.w))) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._underlying._M_dataplus._M_p != paVar1) {
      operator_delete(local_320._underlying._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar5) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    local_1f8._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
               ,"");
    ut::LocationInfo::LocationInfo((LocationInfo *)&local_320,&local_1f8,0x73);
    if ((local_1d8.w == 117.0) && (!NAN(local_1d8.w))) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._underlying._M_dataplus._M_p != paVar1) {
        operator_delete(local_320._underlying._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != paVar5) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
      if (local_218 != (pointer)0x0) {
        operator_delete(local_218);
      }
      std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector(&vStack_230);
      if ((pointer)local_248._0_8_ != (pointer)0x0) {
        operator_delete__((void *)local_248._0_8_);
      }
      if (local_288 != (pointer)0x0) {
        operator_delete(local_288);
      }
      std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector(&vStack_2a0);
      if ((pointer)local_2b8._0_8_ != (pointer)0x0) {
        operator_delete__((void *)local_2b8._0_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
      }
      if (local_1a8._text_lines.
          super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a8._text_lines.
                        super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector
                (&local_1a8._glyph_runs);
      if (local_1a8._glyphs._begin != (positioned_glyph *)0x0) {
        operator_delete__(local_1a8._glyphs._begin);
      }
      if (local_158._text_lines.
          super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_158._text_lines.
                        super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector
                (&local_158._glyph_runs);
      if (local_158._glyphs._begin != (positioned_glyph *)0x0) {
        operator_delete__(local_158._glyphs._begin);
      }
      if (local_108._text_lines.
          super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108._text_lines.
                        super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector
                (&local_108._glyph_runs);
      if (local_108._glyphs._begin != (positioned_glyph *)0x0) {
        operator_delete__(local_108._glyphs._begin);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
      }
      lVar7 = 0x38;
      do {
        if (*(void **)((long)local_b8 + lVar7) != (void *)0x0) {
          operator_delete(*(void **)((long)local_b8 + lVar7));
        }
        lVar7 = lVar7 + -0x28;
      } while (lVar7 != -0x18);
      return;
    }
    pFVar6 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_340._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"Values are not equal!","")
    ;
    ut::FailedAssertion::FailedAssertion(pFVar6,&local_340,(LocationInfo *)&local_320);
    __cxa_throw(pFVar6,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  pFVar6 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_340._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"Values are not equal!","");
  ut::FailedAssertion::FailedAssertion(pFVar6,&local_340,(LocationInfo *)&local_320);
  __cxa_throw(pFVar6,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( SingleLineUnboundLayoutBoxEqualsSumOfAdvances )
			{
				// INIT
				mocks::font_accessor::char_to_index indices1[] = { { L'A', 1 }, { L'B', 0 }, { L'Q', 0 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 13, 0 } },
					{ { 11, 0 } },
				};
				factory_ptr f1 = create_single_font_factory(c_fm1, indices1, glyphs);

				// INIT / ACT
				layout l1;
				layout l2;
				layout l3;

				l1.process(R("A"), limit::none(), *f1);
				l2.process(R("AAB"), limit::none(), *f1);
				l3.process(R("BQA"), limit::none(), *f1);

				// ACT
				box_r box1 = l1.get_box();
				box_r box2 = l2.get_box();
				box_r box3 = l3.get_box();

				// ASSERT
				assert_equal(11.0f, box1.w);
				assert_equal(35.0f, box2.w);
				assert_equal(37.0f, box3.w);

				// INIT
				mocks::font_accessor::char_to_index indices2[] = { { L'A', 0 }, { L'B', 0 }, { L'Q', 0 }, };
				factory_ptr f2 = create_single_font_factory(c_fm1, indices2, glyphs);

				// INIT / ACT
				layout l4;
				layout l5;

				l4.process(R("A"), limit::none(), *f2);
				l5.process(R("ABQABQABQ"), limit::none(), *f2);

				// ACT
				box_r box4 = l4.get_box();
				box_r box5 = l5.get_box();

				// ASSERT
				assert_equal(13.0f, box4.w);
				assert_equal(117.0f, box5.w);
			}